

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixCurrentTime(sqlite3_vfs *NotUsed,double *prNow)

{
  sqlite3_int64 i;
  sqlite3_int64 local_18;
  
  local_18 = 0;
  unixCurrentTimeInt64(NotUsed,&local_18);
  *prNow = (double)local_18 / 86400000.0;
  return 0;
}

Assistant:

static int unixCurrentTime(sqlite3_vfs *NotUsed, double *prNow){
  sqlite3_int64 i = 0;
  int rc;
  UNUSED_PARAMETER(NotUsed);
  rc = unixCurrentTimeInt64(0, &i);
  *prNow = i/86400000.0;
  return rc;
}